

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O1

version_constant __thiscall setup::version::next(version *this)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  version_constant *pvVar3;
  difference_type __d;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  puVar1 = &(anonymous_namespace)::legacy_versions;
  uVar6 = 2;
  do {
    uVar4 = uVar6 >> 1;
    uVar5 = uVar4;
    if (*(uint *)(puVar1 + uVar4 * 4 + 2) <= this->value) {
      uVar5 = ~uVar4 + uVar6;
      puVar1 = puVar1 + uVar4 * 4 + 4;
    }
    uVar6 = uVar5;
  } while (0 < (long)uVar5);
  if (puVar1 != (undefined8 *)&(anonymous_namespace)::versions) {
    pvVar3 = (version_constant *)(puVar1 + 2);
    do {
      if (*(_WordT *)(pvVar3 + 2) == (this->variant)._flags.super__Base_bitset<1UL>._M_w)
      goto LAB_001440a0;
      bVar8 = pvVar3 != &DAT_00175160;
      pvVar3 = pvVar3 + 8;
    } while (bVar8);
  }
  puVar2 = &(anonymous_namespace)::versions;
  uVar6 = 0x72;
  do {
    uVar5 = uVar6 >> 1;
    lVar7 = uVar5 * 0x50;
    if (*(uint *)(puVar2 + lVar7 + 0x40) <= this->value) {
      uVar5 = ~uVar5 + uVar6;
      puVar2 = puVar2 + lVar7 + 0x50;
    }
    uVar6 = uVar5;
  } while (0 < (long)uVar5);
  if (puVar2 != &std::__ioinit) {
    pvVar3 = (version_constant *)(puVar2 + 0x40);
    do {
      if (*(_WordT *)(pvVar3 + 2) == (this->variant)._flags.super__Base_bitset<1UL>._M_w) {
LAB_001440a0:
        return *pvVar3;
      }
      bVar8 = pvVar3 != (version_constant *)&DAT_00177500;
      pvVar3 = pvVar3 + 0x14;
    } while (bVar8);
  }
  return 0;
}

Assistant:

version_constant version::next() {
	
	const known_legacy_version * legacy_end = boost::end(legacy_versions);
	const known_legacy_version * legacy_result;
	legacy_result = std::upper_bound(boost::begin(legacy_versions), legacy_end, value);
	while(legacy_result != legacy_end && legacy_result->variant != variant) {
		legacy_result++;
	}
	if(legacy_result != legacy_end) {
		return legacy_result->version;
	}
	 
	const known_version * end = boost::end(versions);
	const known_version * result = std::upper_bound(boost::begin(versions), end, value);
	while(result != end && result->variant != variant) {
		result++;
	}
	if(result != end) {
		return result->version;
	}
	
	return 0;
}